

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_list_int(kvtree *hash,int *n,int **v)

{
  int iVar1;
  int *__base;
  ulong uVar2;
  kvtree_elem_struct *elem;
  
  *n = 0;
  *v = (int *)0x0;
  iVar1 = kvtree_size(hash);
  if (iVar1 != 0) {
    __base = (int *)kvtree_malloc((long)iVar1 << 2,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                                  ,0x2a0);
    uVar2 = 0;
    elem = (kvtree_elem *)0x0;
    if (hash == (kvtree *)0x0) goto LAB_001045ed;
    while( true ) {
      elem = ((anon_struct_16_2_6a822a49_for_pointers *)hash)->le_next;
LAB_001045ed:
      if (elem == (kvtree_elem *)0x0) break;
      iVar1 = kvtree_elem_key_int(elem);
      __base[uVar2] = iVar1;
      uVar2 = uVar2 + 1;
      hash = (kvtree *)&elem->pointers;
    }
    qsort(__base,uVar2 & 0xffffffff,4,kvtree_cmp_fn_int_asc);
    *n = (int)uVar2;
    *v = __base;
  }
  return 0;
}

Assistant:

int kvtree_list_int(const kvtree* hash, int* n, int** v)
{
  /* assume there aren't any keys */
  *n = 0;
  *v = NULL;

  /* count the number of keys */
  int count = kvtree_size(hash);
  if (count == 0) {
    return KVTREE_SUCCESS;
  }

  /* now allocate array of ints to save keys */
  int* list = (int*) KVTREE_MALLOC(count * sizeof(int));

  /* record key values in array */
  count = 0;
  kvtree_elem* elem;
  for (elem = kvtree_elem_first(hash);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    int key = kvtree_elem_key_int(elem);
    list[count] = key;
    count++;
  }

  /* sort the keys */
  qsort(list, count, sizeof(int), &kvtree_cmp_fn_int_asc);

  *n = count;
  *v = list;

  return KVTREE_SUCCESS;
}